

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_manager.cpp
# Opt level: O1

void __thiscall miniros::PollManager::threadFunc(PollManager *this)

{
  PollWatchers *this_00;
  Connection *pCVar1;
  Connection *pCVar2;
  scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_> lock;
  string local_38;
  
  setThreadName("PollManager");
  disableAllSignalsInThisThread();
  if (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
    this_00 = &this->poll_watchers_;
    do {
      observer::TargetBase::lock(&this_00->super_TargetBase);
      pCVar1 = observer::TargetBase::objBegin(&this_00->super_TargetBase);
      while( true ) {
        pCVar2 = observer::TargetBase::objEnd(&this_00->super_TargetBase);
        if (pCVar1 == pCVar2) break;
        if (pCVar1 != (Connection *)0x0) {
          (*pCVar1->_vptr_Connection[2])(pCVar1);
          pCVar1 = pCVar1->m_next;
        }
      }
      observer::TargetBase::unlock(&this_00->super_TargetBase);
      if (((this->shutting_down_)._M_base._M_i & 1U) != 0) break;
      checkForShutdown();
      PollSet::update(&this->poll_set_,100);
    } while (((this->shutting_down_)._M_base._M_i & 1U) == 0);
  }
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (threadFunc::loc.initialized_ == false) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"miniros.unknown_package","");
    console::initializeLogLocation(&threadFunc::loc,&local_38,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (threadFunc::loc.level_ != Info) {
    threadFunc();
  }
  if (threadFunc::loc.logger_enabled_ == true) {
    threadFunc();
  }
  return;
}

Assistant:

void PollManager::threadFunc()
{
  setThreadName("PollManager");
  disableAllSignalsInThisThread();

  while (!shutting_down_)
  {
    {
      std::scoped_lock<PollWatchers> lock(poll_watchers_);
      auto it = poll_watchers_.begin();
      for (; it != poll_watchers_.end(); it++)
      {
        if (it)
          it->onPollEvents();
      }
    }

    if (shutting_down_)
    {
      break;
    }

    // While it breaks abstraction, it reduces number of mutexes and threading challenges.
    checkForShutdown();

    constexpr int updatePeriodMS = 100;

    poll_set_.update(updatePeriodMS);
  }
  MINIROS_INFO("PollManager thread exit");
}